

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mtc0_hwrena_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint local_1c;
  uint32_t mask;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  local_1c = 0xf;
  if (((env->CP0_Config1 & 0x10U) != 0) && ((env->insn_flags & 0x2000) != 0)) {
    local_1c = 0x1f;
  }
  if ((env->insn_flags & 0x2000) != 0) {
    local_1c = local_1c | 0x20;
  }
  if ((env->CP0_Config3 & 0x2000U) != 0) {
    local_1c = local_1c | 0x20000000;
    if ((arg1 & 0x20000000) == 0) {
      env->hflags = env->hflags & 0xffdfffff;
    }
    else {
      env->hflags = env->hflags | 0x200000;
    }
  }
  env->CP0_HWREna = (uint)arg1 & local_1c;
  return;
}

Assistant:

void helper_mtc0_hwrena(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0x0000000F;

    if ((env->CP0_Config1 & (1 << CP0C1_PC)) &&
        (env->insn_flags & ISA_MIPS32R6)) {
        mask |= (1 << 4);
    }
    if (env->insn_flags & ISA_MIPS32R6) {
        mask |= (1 << 5);
    }
    if (env->CP0_Config3 & (1 << CP0C3_ULRI)) {
        mask |= (1 << 29);

        if (arg1 & (1 << 29)) {
            env->hflags |= MIPS_HFLAG_HWRENA_ULR;
        } else {
            env->hflags &= ~MIPS_HFLAG_HWRENA_ULR;
        }
    }

    env->CP0_HWREna = arg1 & mask;
}